

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O3

bool Grammar::is_dictionary_type(string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  string types_of_dictionary;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  paVar1 = &local_c0.field_2;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Dictionary<","");
  bVar3 = str_utils::starts_with(str,&local_c0);
  bVar4 = true;
  if (bVar3) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,">","");
    bVar4 = str_utils::ends_with(str,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    bVar4 = !bVar4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if (bVar4) {
    bVar4 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)str);
    bVar3 = false;
    if ((int)(uint)local_c0._M_string_length < 1) {
      bVar4 = false;
    }
    else {
      if (*local_c0._M_dataplus._M_p == ',') {
        bVar4 = true;
      }
      else {
        uVar5 = (ulong)((uint)local_c0._M_string_length & 0x7fffffff);
        uVar2 = 1;
        do {
          uVar6 = uVar2;
          if (uVar5 == uVar6) {
            bVar4 = uVar6 < uVar5;
            goto LAB_0014012a;
          }
          uVar2 = uVar6 + 1;
        } while (local_c0._M_dataplus._M_p[uVar6] != ',');
        bVar4 = uVar6 < uVar5;
      }
      std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_c0);
      str_utils::trim(&local_a0,&local_60);
      bVar3 = is_object_type(&local_a0);
      if (bVar3) {
        std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_c0);
        str_utils::trim(&local_40,&local_80);
        bVar3 = is_object_type(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != &local_40.field_2) {
          operator_delete(local_40._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
LAB_0014012a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
    bVar4 = (bool)(bVar4 & bVar3);
  }
  return bVar4;
}

Assistant:

bool Grammar::is_dictionary_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Dictionary<") || !str_utils::ends_with(str, ">"))
        return false;
    std::string types_of_dictionary = str.substr(11, int(str.size()) - 12);
    for (int i = 0; i < int(types_of_dictionary.size()); i++)
        if (types_of_dictionary[i] == ',')
            return is_object_type(str_utils::trim(types_of_dictionary.substr(0, i))) &&
                   is_object_type(str_utils::trim(types_of_dictionary.substr(i + 1)));
    return false;
}